

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::Abbrev>::mapping(IO *IO,Abbrev *Abbrev)

{
  EmptyContext local_1c;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [5];
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::yaml::Hex32,llvm::yaml::EmptyContext>
            (IO,"Code",&Abbrev->Code,true,local_19);
  yaml::IO::processKey<llvm::dwarf::Tag,llvm::yaml::EmptyContext>
            (IO,"Tag",&Abbrev->Tag,true,&local_1a);
  yaml::IO::processKey<llvm::dwarf::Constants,llvm::yaml::EmptyContext>
            (IO,"Children",&Abbrev->Children,true,&local_1b);
  yaml::IO::
  processKey<std::vector<llvm::DWARFYAML::AttributeAbbrev,std::allocator<llvm::DWARFYAML::AttributeAbbrev>>,llvm::yaml::EmptyContext>
            (IO,"Attributes",&Abbrev->Attributes,true,&local_1c);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::Abbrev>::mapping(IO &IO,
                                               DWARFYAML::Abbrev &Abbrev) {
  IO.mapRequired("Code", Abbrev.Code);
  IO.mapRequired("Tag", Abbrev.Tag);
  IO.mapRequired("Children", Abbrev.Children);
  IO.mapRequired("Attributes", Abbrev.Attributes);
}